

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int luaD_poscall(lua_State *L,CallInfo *ci,StkId firstResult,int nres)

{
  undefined8 *puVar1;
  short sVar2;
  StkId pTVar3;
  Value *pVVar4;
  undefined8 uVar5;
  Value VVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  Value *pVVar10;
  uint uVar11;
  TValue *pTVar12;
  
  sVar2 = ci->nresults;
  uVar11 = (uint)sVar2;
  pTVar12 = firstResult;
  if ((L->hookmask & 6U) != 0) {
    if ((L->hookmask & 2U) != 0) {
      pTVar3 = L->stack;
      luaD_hook(L,1,-1);
      firstResult = (StkId)(((long)firstResult - (long)pTVar3) + (long)L->stack);
    }
    L->oldpc = (ci->previous->u).l.savedpc;
    pTVar12 = firstResult;
  }
  pVVar4 = &ci->func->value_;
  L->ci = ci->previous;
  if (sVar2 != 0) {
    if (sVar2 == 1) {
      if (nres == 0) {
        pTVar12 = &luaO_nilobject_;
      }
      VVar6 = *(Value *)&pTVar12->tt_;
      *pVVar4 = pTVar12->value_;
      pVVar4[1] = VVar6;
    }
    else {
      if (sVar2 == -1) {
        if (0 < nres) {
          lVar9 = 0;
          do {
            puVar1 = (undefined8 *)((long)&pTVar12->value_ + lVar9);
            uVar5 = puVar1[1];
            *(undefined8 *)((long)pVVar4 + lVar9) = *puVar1;
            ((undefined8 *)((long)pVVar4 + lVar9))[1] = uVar5;
            lVar9 = lVar9 + 0x10;
          } while ((ulong)(uint)nres << 4 != lVar9);
        }
        iVar7 = 0;
        uVar11 = nres;
        goto LAB_0011311e;
      }
      if (nres < (int)uVar11) {
        if (nres < 1) {
          uVar8 = 0;
        }
        else {
          lVar9 = 0;
          uVar8 = 0;
          do {
            puVar1 = (undefined8 *)((long)&pTVar12->value_ + lVar9);
            uVar5 = puVar1[1];
            *(undefined8 *)((long)pVVar4 + lVar9) = *puVar1;
            ((undefined8 *)((long)pVVar4 + lVar9))[1] = uVar5;
            uVar8 = uVar8 + 1;
            lVar9 = lVar9 + 0x10;
          } while ((uint)nres != uVar8);
        }
        if ((int)uVar8 < (int)uVar11) {
          lVar9 = (ulong)uVar11 - (uVar8 & 0xffffffff);
          pVVar10 = pVVar4 + (uVar8 & 0xffffffff) * 2 + 1;
          do {
            pVVar10->b = 0;
            pVVar10 = pVVar10 + 2;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
      }
      else if (0 < sVar2) {
        lVar9 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pTVar12->value_ + lVar9);
          uVar5 = puVar1[1];
          *(undefined8 *)((long)pVVar4 + lVar9) = *puVar1;
          ((undefined8 *)((long)pVVar4 + lVar9))[1] = uVar5;
          lVar9 = lVar9 + 0x10;
        } while ((ulong)uVar11 << 4 != lVar9);
      }
    }
  }
  iVar7 = 1;
LAB_0011311e:
  L->top = (StkId)(pVVar4 + (long)(int)uVar11 * 2);
  return iVar7;
}

Assistant:

int luaD_poscall (lua_State *L, CallInfo *ci, StkId firstResult, int nres) {
  StkId res;
  int wanted = ci->nresults;
  if (L->hookmask & (LUA_MASKRET | LUA_MASKLINE)) {
    if (L->hookmask & LUA_MASKRET) {
      ptrdiff_t fr = savestack(L, firstResult);  /* hook may change stack */
      luaD_hook(L, LUA_HOOKRET, -1);
      firstResult = restorestack(L, fr);
    }
    L->oldpc = ci->previous->u.l.savedpc;  /* 'oldpc' for caller function */
  }
  res = ci->func;  /* res == final position of 1st result */
  L->ci = ci->previous;  /* back to caller */
  /* move results to proper place */
  return moveresults(L, firstResult, res, nres, wanted);
}